

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O1

int Ssw_RarSimulateGia(Gia_Man_t *p,Ssw_RarPars_t *pPars)

{
  int iVar1;
  Vec_Int_t *vFfMask;
  Gia_Man_t *p_00;
  Aig_Man_t *pAig;
  
  if (pPars->fUseFfGrouping == 0) {
    pAig = Gia_ManToAigSimple(p);
  }
  else {
    vFfMask = Ssw_RarRandomPermFlop(p->nRegs,10);
    p_00 = Gia_ManDupPermFlopGap(p,vFfMask);
    if (vFfMask->pArray != (int *)0x0) {
      free(vFfMask->pArray);
      vFfMask->pArray = (int *)0x0;
    }
    if (vFfMask != (Vec_Int_t *)0x0) {
      free(vFfMask);
    }
    pAig = Gia_ManToAigSimple(p_00);
    Gia_ManStop(p_00);
  }
  iVar1 = Ssw_RarSimulate(pAig,pPars);
  Abc_CexFree(p->pCexSeq);
  p->pCexSeq = pAig->pSeqModel;
  pAig->pSeqModel = (Abc_Cex_t *)0x0;
  Aig_ManStop(pAig);
  return iVar1;
}

Assistant:

int Ssw_RarSimulateGia( Gia_Man_t * p, Ssw_RarPars_t * pPars )
{
    Aig_Man_t * pAig;
    int RetValue;
    if ( pPars->fUseFfGrouping )
    {
        Vec_Int_t * vPerm = Ssw_RarRandomPermFlop( Gia_ManRegNum(p), 10 );
        Gia_Man_t * pTemp = Gia_ManDupPermFlopGap( p, vPerm );
        Vec_IntFree( vPerm );
        pAig = Gia_ManToAigSimple( pTemp );
        Gia_ManStop( pTemp );
    }
    else
        pAig = Gia_ManToAigSimple( p );
    RetValue = Ssw_RarSimulate( pAig, pPars );
    // save counter-example
    Abc_CexFree( p->pCexSeq );
    p->pCexSeq = pAig->pSeqModel; pAig->pSeqModel = NULL;
    Aig_ManStop( pAig );
    return RetValue;
}